

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O1

void predict_iforest<double,int>
               (double *numeric_data,int *categ_data,bool is_col_major,size_t ld_numeric,
               size_t ld_categ,double *Xc,int *Xc_ind,int *Xc_indptr,double *Xr,int *Xr_ind,
               int *Xr_indptr,size_t nrows,int nthreads,bool standardize,IsoForest *model_outputs,
               ExtIsoForest *model_outputs_ext,double *output_depths,int *tree_num,
               double *per_tree_depths,TreesIndexer *indexer)

{
  double dVar1;
  pointer pSVar2;
  pointer pvVar3;
  pointer puVar4;
  pointer pvVar5;
  pointer pIVar6;
  void *__tmp;
  size_t sVar7;
  ulong uVar8;
  double *pdVar9;
  ExtIsoForest *pEVar10;
  undefined8 uVar11;
  int *piVar12;
  long lVar13;
  size_t *psVar14;
  int *piVar15;
  size_t row_00;
  pointer pIVar16;
  pointer pvVar17;
  pointer pvVar18;
  undefined4 uVar19;
  long lVar20;
  double *tree_depth;
  ulong uVar21;
  double *pdVar22;
  size_t *psVar23;
  long lVar24;
  size_t row;
  double *pdVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  double dVar29;
  undefined1 auVar30 [16];
  PredictionData<double,_int> prediction_data;
  double local_f8;
  double *local_f0;
  double *local_e8;
  double dStack_e0;
  long local_d0;
  size_t local_c8;
  long local_c0 [2];
  int local_ac;
  size_t local_a8;
  int *local_a0;
  ulong local_98;
  PredictionData<double,_int> local_90;
  
  if (nrows == 0) {
    return;
  }
  local_90.nrows = nrows;
  local_90.Xc_ind = Xc_ind;
  local_90.Xc_indptr = Xc_indptr;
  local_90.Xr = Xr;
  local_90.Xr_ind = Xr_ind;
  local_90.Xr_indptr = Xr_indptr;
  local_ac = (int)nrows;
  if ((ulong)(long)nthreads <= nrows) {
    local_ac = nthreads;
  }
  local_e8 = (double *)ld_numeric;
  local_f0 = numeric_data;
  local_a0 = categ_data;
  local_90.numeric_data = numeric_data;
  local_90.categ_data = categ_data;
  local_90.is_col_major = is_col_major;
  local_90.ncols_numeric = ld_numeric;
  local_90.ncols_categ = ld_categ;
  local_90.Xc = Xc;
  if ((categ_data == (int *)0x0 || is_col_major) && Xc_indptr != (int *)0x0) {
    Xc_indptr = (int *)output_depths;
    batched_csc_predict<double,int>
              (&local_90,nthreads,model_outputs,model_outputs_ext,output_depths,tree_num,
               per_tree_depths);
  }
  else if (model_outputs == (IsoForest *)0x0) {
    if ((((Xc_indptr == (int *)0x0) && (Xr_indptr == (int *)0x0)) && (categ_data == (int *)0x0)) &&
       ((model_outputs_ext->missing_action == Fail &&
        (model_outputs_ext->has_range_penalty == false)))) {
      if (nrows == 1 || !is_col_major) {
        local_e8 = (double *)(nrows * 4);
        lVar13 = 0;
        sVar7 = 0;
        do {
          local_f8 = 0.0;
          pvVar18 = (model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar24 = (long)(model_outputs_ext->hplanes).
                         super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18;
          if (lVar24 != 0) {
            uVar8 = (lVar24 >> 3) * -0x5555555555555555;
            lVar24 = 0;
            uVar21 = 0;
            pdVar22 = per_tree_depths;
            pdVar9 = (double *)tree_num;
            do {
              Xc_indptr = (int *)pdVar9;
              if (tree_num == (int *)0x0) {
                Xc_indptr = tree_num;
              }
              pdVar25 = (double *)(uVar8 * lVar13 + (long)pdVar22);
              if (per_tree_depths == (double *)0x0) {
                pdVar25 = (double *)0x0;
              }
              traverse_hplane_fast_rowmajor<double,int>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar18->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>
                                 )._M_impl + lVar24),model_outputs_ext,
                         local_90.numeric_data + local_90.ncols_numeric * sVar7,&local_f8,Xc_indptr,
                         pdVar25,sVar7);
              uVar21 = uVar21 + 1;
              pvVar18 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar8 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18 >> 3) *
                      -0x5555555555555555;
              pdVar9 = (double *)((long)pdVar9 + (long)local_e8);
              pdVar22 = pdVar22 + 1;
              lVar24 = lVar24 + 0x18;
            } while (uVar21 < uVar8);
          }
          output_depths[sVar7] = local_f8;
          sVar7 = sVar7 + 1;
          lVar13 = lVar13 + 8;
        } while (sVar7 != nrows);
      }
      else {
        local_e8 = (double *)(nrows * 4);
        lVar13 = 0;
        sVar7 = 0;
        do {
          local_f8 = 0.0;
          pvVar18 = (model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar24 = (long)(model_outputs_ext->hplanes).
                         super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18;
          if (lVar24 != 0) {
            uVar8 = (lVar24 >> 3) * -0x5555555555555555;
            lVar24 = 0;
            uVar21 = 0;
            pdVar22 = (double *)tree_num;
            pdVar9 = per_tree_depths;
            do {
              Xc_indptr = (int *)pdVar22;
              if (tree_num == (int *)0x0) {
                Xc_indptr = tree_num;
              }
              pdVar25 = (double *)(uVar8 * lVar13 + (long)pdVar9);
              if (per_tree_depths == (double *)0x0) {
                pdVar25 = (double *)0x0;
              }
              traverse_hplane_fast_colmajor<PredictionData<double,int>,int>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&(pvVar18->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>
                                 )._M_impl + lVar24),model_outputs_ext,&local_90,&local_f8,Xc_indptr
                         ,pdVar25,sVar7);
              uVar21 = uVar21 + 1;
              pvVar18 = (model_outputs_ext->hplanes).
                        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar8 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18 >> 3) *
                      -0x5555555555555555;
              pdVar22 = (double *)((long)pdVar22 + (long)local_e8);
              pdVar9 = pdVar9 + 1;
              lVar24 = lVar24 + 0x18;
            } while (uVar21 < uVar8);
          }
          output_depths[sVar7] = local_f8;
          sVar7 = sVar7 + 1;
          lVar13 = lVar13 + 8;
        } while (sVar7 != nrows);
      }
    }
    else {
      local_c8 = nrows + (nrows == 0);
      local_f0 = (double *)(nrows * 4);
      local_e8 = (double *)0x0;
      sVar7 = 0;
      do {
        local_f8 = 0.0;
        pvVar18 = (model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = (long)(model_outputs_ext->hplanes).
                       super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18;
        if (lVar13 != 0) {
          uVar8 = (lVar13 >> 3) * -0x5555555555555555;
          lVar13 = 0;
          uVar21 = 0;
          piVar15 = tree_num;
          pdVar22 = per_tree_depths;
          do {
            piVar12 = piVar15;
            if (tree_num == (int *)0x0) {
              piVar12 = tree_num;
            }
            pdVar9 = (double *)(uVar8 * (long)local_e8 + (long)pdVar22);
            if (per_tree_depths == (double *)0x0) {
              pdVar9 = (double *)0x0;
            }
            traverse_hplane<PredictionData<double,int>,int,ImputedData<int,double>>
                      ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                       ((long)&(pvVar18->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                               _M_impl + lVar13),model_outputs_ext,&local_90,&local_f8,
                       (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                       (ImputedData<int,_double> *)0x0,piVar12,pdVar9,sVar7);
            uVar21 = uVar21 + 1;
            pvVar18 = (model_outputs_ext->hplanes).
                      super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar8 = ((long)(model_outputs_ext->hplanes).
                           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18 >> 3) *
                    -0x5555555555555555;
            piVar15 = (int *)((long)piVar15 + (long)local_f0);
            pdVar22 = pdVar22 + 1;
            lVar13 = lVar13 + 0x18;
          } while (uVar21 < uVar8);
        }
        output_depths[sVar7] = local_f8;
        sVar7 = sVar7 + 1;
        Xc_indptr = (int *)(local_e8 + 1);
        local_e8 = (double *)Xc_indptr;
      } while (sVar7 != local_c8);
    }
  }
  else {
    if (model_outputs->missing_action == Fail) {
      if (model_outputs->new_cat_action == Weighted) {
        if (((Xc_indptr == (int *)0x0) && (Xr_indptr == (int *)0x0)) &&
           (categ_data == (int *)0x0 || model_outputs->cat_split_type == SingleCateg))
        goto LAB_00145d23;
      }
      else {
        Xc_indptr = (int *)((ulong)Xc_indptr | (ulong)Xr_indptr);
        if ((double *)Xc_indptr == (double *)0x0) {
LAB_00145d23:
          if (model_outputs->has_range_penalty == false) {
            Xc_indptr = (int *)((ulong)Xc_indptr & 0xffffffffffffff00);
            if ((nrows == 1 || !is_col_major) && categ_data == (int *)0x0) {
              pvVar17 = (model_outputs->trees).
                        super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar5 = (model_outputs->trees).
                       super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              local_c8 = ((long)pvVar5 - (long)pvVar17 >> 3) * -0x5555555555555555;
              Xc_indptr = (int *)(local_c8 + (local_c8 == 0));
              lVar13 = 0;
              do {
                if (pvVar5 == pvVar17) {
                  dVar29 = 0.0;
                }
                else {
                  dVar29 = 0.0;
                  pdVar22 = (double *)0x0;
                  do {
                    piVar15 = tree_num + (long)pdVar22 * nrows;
                    if (tree_num == (int *)0x0) {
                      piVar15 = (int *)0x0;
                    }
                    pdVar9 = per_tree_depths + (long)(local_c8 * lVar13 + (long)pdVar22);
                    if (per_tree_depths == (double *)0x0) {
                      pdVar9 = (double *)0x0;
                    }
                    pIVar6 = pvVar17[(long)pdVar22].
                             super__Vector_base<IsoTree,_std::allocator<IsoTree>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    pIVar16 = pIVar6;
                    if (pIVar6->tree_left == 0) {
                      sVar7 = 0;
                    }
                    else {
                      psVar14 = &pIVar6->tree_left;
                      do {
                        psVar23 = &pIVar16->tree_right;
                        if (numeric_data[lVar13 * ld_numeric + pIVar16->col_num] <=
                            pIVar16->num_split) {
                          psVar23 = psVar14;
                        }
                        sVar7 = *psVar23;
                        pIVar16 = pIVar6 + sVar7;
                        psVar14 = &pIVar6[sVar7].tree_left;
                      } while (*psVar14 != 0);
                    }
                    dVar1 = pIVar16->score;
                    if (piVar15 != (int *)0x0) {
                      piVar15[lVar13] = (int)sVar7;
                    }
                    if (pdVar9 != (double *)0x0) {
                      *pdVar9 = dVar1;
                    }
                    dVar29 = dVar29 + dVar1;
                    pdVar22 = (double *)((long)pdVar22 + 1);
                  } while (pdVar22 != (double *)Xc_indptr);
                }
                output_depths[lVar13] = dVar29;
                lVar13 = lVar13 + 1;
              } while (lVar13 != nrows + (nrows == 0));
            }
            else {
              local_f0 = (double *)(nrows + (nrows == 0));
              local_e8 = (double *)(nrows * 4);
              lVar13 = 0;
              pdVar22 = (double *)0x0;
              do {
                local_f8 = 0.0;
                pvVar17 = (model_outputs->trees).
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar24 = (long)(model_outputs->trees).
                               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17;
                if (lVar24 != 0) {
                  uVar8 = (lVar24 >> 3) * -0x5555555555555555;
                  lVar24 = 0;
                  uVar21 = 0;
                  pdVar9 = per_tree_depths;
                  pdVar25 = (double *)tree_num;
                  do {
                    Xc_indptr = (int *)pdVar25;
                    if (tree_num == (int *)0x0) {
                      Xc_indptr = tree_num;
                    }
                    tree_depth = (double *)(uVar8 * lVar13 + (long)pdVar9);
                    if (per_tree_depths == (double *)0x0) {
                      tree_depth = (double *)0x0;
                    }
                    traverse_itree_no_recurse<PredictionData<double,int>,int>
                              ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                               ((long)&(pvVar17->
                                       super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                       _M_impl + lVar24),model_outputs,&local_90,&local_f8,Xc_indptr
                               ,tree_depth,(size_t)pdVar22);
                    uVar21 = uVar21 + 1;
                    pvVar17 = (model_outputs->trees).
                              super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar8 = ((long)(model_outputs->trees).
                                   super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17 >> 3)
                            * -0x5555555555555555;
                    pdVar25 = (double *)((long)pdVar25 + (long)local_e8);
                    pdVar9 = pdVar9 + 1;
                    lVar24 = lVar24 + 0x18;
                  } while (uVar21 < uVar8);
                }
                output_depths[(long)pdVar22] = local_f8;
                pdVar22 = (double *)((long)pdVar22 + 1);
                lVar13 = lVar13 + 8;
              } while (pdVar22 != local_f0);
            }
            goto LAB_00145816;
          }
        }
      }
    }
    sVar7 = nrows + (nrows == 0);
    local_d0 = 0;
    local_c8 = nrows * 4;
    local_f0 = (double *)0x0;
    uVar8 = 0;
    row_00 = 0;
    local_a8 = sVar7;
    do {
      if ((uVar8 & 1) == 0) {
        pvVar17 = (model_outputs->trees).
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = (long)(model_outputs->trees).
                       super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17;
        local_98 = uVar8;
        if (lVar13 == 0) {
          dVar29 = 0.0;
        }
        else {
          uVar8 = (lVar13 >> 3) * -0x5555555555555555;
          dVar29 = 0.0;
          lVar13 = 0;
          uVar21 = 0;
          piVar15 = tree_num;
          pdVar22 = per_tree_depths;
          do {
            piVar12 = piVar15;
            if (tree_num == (int *)0x0) {
              piVar12 = tree_num;
            }
            pdVar9 = (double *)(uVar8 * (long)local_f0 + (long)pdVar22);
            if (per_tree_depths == (double *)0x0) {
              pdVar9 = (double *)0x0;
            }
            Xc_indptr = (int *)0x0;
            local_e8 = (double *)dVar29;
            dVar29 = traverse_itree<PredictionData<double,int>,int,ImputedData<int,double>>
                               ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                                ((long)&(pvVar17->
                                        super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                        _M_impl + lVar13),model_outputs,&local_90,
                                (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                                (ImputedData<int,_double> *)0x0,0.0,row_00,piVar12,pdVar9,0);
            dVar29 = (double)local_e8 + dVar29;
            uVar21 = uVar21 + 1;
            pvVar17 = (model_outputs->trees).
                      super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar8 = ((long)(model_outputs->trees).
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17 >> 3) *
                    -0x5555555555555555;
            piVar15 = (int *)((long)piVar15 + local_c8);
            pdVar22 = pdVar22 + 1;
            lVar13 = lVar13 + 0x18;
          } while (uVar21 < uVar8);
        }
        output_depths[row_00] = dVar29;
        sVar7 = local_a8;
        uVar8 = local_98;
      }
      row_00 = row_00 + 1;
      local_f0 = local_f0 + 1;
    } while (row_00 != sVar7);
    if ((uVar8 & 1) != 0) {
      local_c0[0] = local_d0;
      if (local_d0 != 0) {
        std::__exception_ptr::exception_ptr::_M_addref();
      }
      uVar11 = std::rethrow_exception((exception_ptr)local_c0);
      if (local_d0 != 0) {
        std::__exception_ptr::exception_ptr::_M_release();
      }
      _Unwind_Resume(uVar11);
    }
    if (local_d0 != 0) {
      std::__exception_ptr::exception_ptr::_M_release();
    }
  }
LAB_00145816:
  pEVar10 = (ExtIsoForest *)model_outputs;
  if (model_outputs == (IsoForest *)0x0) {
    pEVar10 = model_outputs_ext;
  }
  lVar13 = ((long)(pEVar10->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pEVar10->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((model_outputs == (IsoForest *)0x0) ||
     (bVar26 = true, model_outputs->scoring_metric != Density)) {
    if (model_outputs_ext == (ExtIsoForest *)0x0) {
      bVar26 = false;
    }
    else {
      bVar26 = model_outputs_ext->scoring_metric == Density;
    }
  }
  auVar30._8_4_ = (int)((ulong)lVar13 >> 0x20);
  auVar30._0_8_ = lVar13;
  auVar30._12_4_ = 0x45300000;
  if ((model_outputs == (IsoForest *)0x0) ||
     (bVar27 = true, model_outputs->scoring_metric != BoxedRatio)) {
    if (model_outputs_ext == (ExtIsoForest *)0x0) {
      bVar27 = false;
    }
    else {
      bVar27 = model_outputs_ext->scoring_metric == BoxedRatio;
    }
  }
  dStack_e0 = auVar30._8_8_ - 1.9342813113834067e+25;
  if (model_outputs != (IsoForest *)0x0) {
    Xc_indptr = (int *)CONCAT71((int7)((ulong)Xc_indptr >> 8),1);
    uVar19 = SUB84(Xc_indptr,0);
    if (model_outputs->scoring_metric == BoxedDensity) goto LAB_001458ca;
  }
  if (model_outputs_ext == (ExtIsoForest *)0x0) {
    uVar19 = 0;
  }
  else {
    uVar19 = (undefined4)
             CONCAT71((int7)((ulong)Xc_indptr >> 8),
                      model_outputs_ext->scoring_metric == BoxedDensity);
  }
LAB_001458ca:
  if ((model_outputs == (IsoForest *)0x0) ||
     (bVar28 = true, model_outputs->scoring_metric != BoxedDensity2)) {
    if (model_outputs_ext == (ExtIsoForest *)0x0) {
      bVar28 = false;
    }
    else {
      bVar28 = model_outputs_ext->scoring_metric == BoxedDensity2;
    }
  }
  local_e8 = (double *)(dStack_e0 + ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0))
  ;
  local_f0 = (double *)CONCAT44(local_f0._4_4_,uVar19);
  if (standardize) {
    if (bVar26 || bVar28) {
      lVar13 = 0;
      do {
        output_depths[lVar13] = output_depths[lVar13] / -(double)local_e8;
        lVar13 = lVar13 + 1;
      } while (nrows + (nrows == 0) != lVar13);
    }
    else {
      lVar13 = nrows + (nrows == 0);
      if ((char)uVar19 == '\0') {
        if (bVar27) {
          lVar24 = 0;
          do {
            output_depths[lVar24] = output_depths[lVar24] / (double)local_e8;
            lVar24 = lVar24 + 1;
          } while (lVar13 != lVar24);
        }
        else {
          local_e8 = (double *)((double)local_e8 * pEVar10->exp_avg_depth);
          lVar24 = 0;
          do {
            dVar29 = exp2(-output_depths[lVar24] / (double)local_e8);
            output_depths[lVar24] = dVar29;
            lVar24 = lVar24 + 1;
          } while (lVar13 != lVar24);
        }
      }
      else {
        lVar24 = 0;
        do {
          dVar29 = exp(output_depths[lVar24] / (double)local_e8);
          output_depths[lVar24] = -dVar29;
          lVar24 = lVar24 + 1;
        } while (lVar13 != lVar24);
      }
    }
  }
  else if ((bVar26 || (char)uVar19 != '\0') || bVar28) {
    lVar13 = 0;
    do {
      dVar29 = exp(output_depths[lVar13] / (double)local_e8);
      output_depths[lVar13] = dVar29;
      lVar13 = lVar13 + 1;
    } while (nrows + (nrows == 0) != lVar13);
  }
  else if (bVar27) {
    lVar13 = 0;
    do {
      output_depths[lVar13] = output_depths[lVar13] / -(double)local_e8;
      lVar13 = lVar13 + 1;
    } while (nrows + (nrows == 0) != lVar13);
  }
  else {
    lVar13 = 0;
    do {
      output_depths[lVar13] = output_depths[lVar13] / (double)local_e8;
      lVar13 = lVar13 + 1;
    } while (nrows + (nrows == 0) != lVar13);
  }
  if ((per_tree_depths != (double *)0x0) && ((bVar26 || ((ulong)local_f0 & 1) != 0) || bVar28)) {
    pEVar10 = (ExtIsoForest *)model_outputs;
    if (model_outputs == (IsoForest *)0x0) {
      pEVar10 = model_outputs_ext;
    }
    lVar13 = nrows * -0x5555555555555555 *
             ((long)(pEVar10->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pEVar10->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
    if (lVar13 != 0) {
      lVar24 = 0;
      do {
        dVar29 = exp(per_tree_depths[lVar24]);
        per_tree_depths[lVar24] = dVar29;
        lVar24 = lVar24 + 1;
      } while (lVar13 - lVar24 != 0);
    }
  }
  if (tree_num != (int *)0x0) {
    if ((indexer != (TreesIndexer *)0x0) &&
       (pSVar2 = (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_start,
       pSVar2 != (indexer->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_finish)) {
      pEVar10 = (ExtIsoForest *)model_outputs;
      if (model_outputs == (IsoForest *)0x0) {
        pEVar10 = model_outputs_ext;
      }
      pvVar18 = (pEVar10->hplanes).
                super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = (pEVar10->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((model_outputs == (IsoForest *)0x0) ||
         ((model_outputs->missing_action != Divide &&
          (((model_outputs->new_cat_action != Weighted || (local_a0 == (int *)0x0)) ||
           (model_outputs->cat_split_type != SubSet)))))) {
        if (pvVar3 == pvVar18) {
          return;
        }
        lVar24 = ((long)pvVar3 - (long)pvVar18 >> 3) * -0x5555555555555555;
        lVar13 = 0;
        do {
          puVar4 = pSVar2[lVar13].terminal_node_mappings.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar20 = 0;
          do {
            tree_num[lVar20] = (int)puVar4[tree_num[lVar20]];
            lVar20 = lVar20 + 1;
          } while (nrows + (nrows == 0) != lVar20);
          lVar13 = lVar13 + 1;
          tree_num = tree_num + nrows;
        } while (lVar13 != lVar24 + (ulong)(lVar24 == 0));
        return;
      }
    }
    remap_terminal_trees<PredictionData<double,int>,int>
              (model_outputs,model_outputs_ext,&local_90,tree_num,local_ac);
  }
  return;
}

Assistant:

void predict_iforest(real_t *restrict numeric_data, int *restrict categ_data,
                     bool is_col_major, size_t ld_numeric, size_t ld_categ,
                     real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                     real_t *restrict Xr, sparse_ix *restrict Xr_ind, sparse_ix *restrict Xr_indptr,
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double *restrict output_depths,   sparse_ix *restrict tree_num,
                     double *restrict per_tree_depths,
                     TreesIndexer *indexer)
{
    if (unlikely(!nrows)) return;

    /* put data in a struct for passing it in fewer lines */
    PredictionData<real_t, sparse_ix>
                   prediction_data = {numeric_data, categ_data, nrows,
                                      is_col_major, ld_numeric, ld_categ,
                                      Xc, Xc_ind, Xc_indptr,
                                      Xr, Xr_ind, Xr_indptr};

    int nthreads_orig = nthreads;
    if ((size_t)nthreads > nrows)
        nthreads = nrows;

    /* For batch predictions of sparse CSC, will take a specialized route */
    if (prediction_data.Xc_indptr != NULL && (prediction_data.categ_data == NULL || prediction_data.is_col_major))
    {
        batched_csc_predict(prediction_data, nthreads_orig,
                            model_outputs, model_outputs_ext,
                            output_depths, tree_num,
                            per_tree_depths);
    }

    /* Regular case (no specialized CSC route) */
    else if (model_outputs != NULL)
    {
        if (
            model_outputs->missing_action == Fail &&
            (model_outputs->new_cat_action != Weighted || model_outputs->cat_split_type == SingleCateg || prediction_data.categ_data == NULL) &&
            prediction_data.Xc_indptr == NULL && prediction_data.Xr_indptr == NULL &&
            !model_outputs->has_range_penalty
            )
        {
            if (prediction_data.categ_data == NULL && (nrows == 1 || !prediction_data.is_col_major))
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        traverse_itree_fast(model_outputs->trees[tree],
                                            *model_outputs,
                                            prediction_data.numeric_data + row * prediction_data.ncols_numeric,
                                            score,
                                            (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                            (per_tree_depths == NULL)?
                                                NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                            (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }

            else
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        traverse_itree_no_recurse(model_outputs->trees[tree],
                                                  *model_outputs,
                                                  prediction_data,
                                                  score,
                                                  (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                  (per_tree_depths == NULL)?
                                                      NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                                  (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }
        }

        else
        {
            bool threw_exception = false;
            std::exception_ptr ex = NULL;

            #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                    shared(nrows, model_outputs, prediction_data, output_depths, tree_num, per_tree_depths, threw_exception, ex)
            for (size_t_for row = 0; row < (decltype(row))nrows; row++)
            {
                if (threw_exception) continue;
                double score = 0;
                try
                {
                    for (size_t tree = 0; tree < model_outputs->trees.size(); tree++)
                    {
                        score += traverse_itree(model_outputs->trees[tree],
                                                *model_outputs,
                                                prediction_data,
                                                (std::vector<ImputeNode>*)NULL,
                                                (ImputedData<sparse_ix, double>*)NULL,
                                                (double)0,
                                                (size_t) row,
                                                (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                (per_tree_depths == NULL)?
                                                    NULL : (per_tree_depths + tree + row*model_outputs->trees.size()),
                                                (size_t) 0);
                    }
                    output_depths[row] = score;
                }
                catch (...)
                {
                    #pragma omp critical
                    {
                        if (!threw_exception)
                        {
                            threw_exception = true;
                            ex = std::current_exception();
                        }
                    }
                }
            }

            if (threw_exception)
                std::rethrow_exception(ex);
        }
    }
    

    else
    {
        if (
            model_outputs_ext->missing_action == Fail &&
            prediction_data.categ_data == NULL &&
            prediction_data.Xc_indptr == NULL &&
            prediction_data.Xr_indptr == NULL &&
            !model_outputs_ext->has_range_penalty
            )
        {
            if (prediction_data.is_col_major && nrows > 1)
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                    {
                        traverse_hplane_fast_colmajor(model_outputs_ext->hplanes[tree],
                                                      *model_outputs_ext,
                                                      prediction_data,
                                                      score,
                                                      (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                      (per_tree_depths == NULL)?
                                                            NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                                      (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }

            else
            {
                #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                        shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
                for (size_t_for row = 0; row < (decltype(row))nrows; row++)
                {
                    double score = 0;
                    for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                    {
                        traverse_hplane_fast_rowmajor(model_outputs_ext->hplanes[tree],
                                                      *model_outputs_ext,
                                                      prediction_data.numeric_data + row * prediction_data.ncols_numeric,
                                                      score,
                                                      (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                                      (per_tree_depths == NULL)?
                                                            NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                                      (size_t) row);
                    }
                    output_depths[row] = score;
                }
            }
        }

        else
        {
            #pragma omp parallel for if(nrows > 1) schedule(static) num_threads(nthreads) \
                    shared(nrows, model_outputs_ext, prediction_data, output_depths, tree_num, per_tree_depths)
            for (size_t_for row = 0; row < (decltype(row))nrows; row++)
            {
                double score = 0;
                for (size_t tree = 0; tree < model_outputs_ext->hplanes.size(); tree++)
                {
                    traverse_hplane(model_outputs_ext->hplanes[tree],
                                    *model_outputs_ext,
                                    prediction_data,
                                    score,
                                    (std::vector<ImputeNode>*)NULL,
                                    (ImputedData<sparse_ix, double>*)NULL,
                                    (tree_num == NULL)? NULL : (tree_num + nrows * tree),
                                    (per_tree_depths == NULL)?
                                        NULL : (per_tree_depths + tree + row*model_outputs_ext->hplanes.size()),
                                    (size_t) row);
                }
                output_depths[row] = score;
            }
        }
    }

    /* translate sum-of-depths to outlier score */
    double ntrees, depth_divisor;
    if (model_outputs != NULL)
    {
        ntrees = (double) model_outputs->trees.size();
        depth_divisor = ntrees * (model_outputs->exp_avg_depth);
    }

    else
    {
        ntrees = (double) model_outputs_ext->hplanes.size();
        depth_divisor = ntrees * (model_outputs_ext->exp_avg_depth);
    }

    
    /* for density and boxed_ratio, each tree will have 'log(d)'' instead of 'd' */
    bool is_density = (model_outputs != NULL && model_outputs->scoring_metric == Density) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == Density);
    bool is_bratio  = (model_outputs != NULL && model_outputs->scoring_metric == BoxedRatio) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedRatio);
    bool is_bdens   = (model_outputs != NULL && model_outputs->scoring_metric == BoxedDensity) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedDensity);
    bool is_bdens2  = (model_outputs != NULL && model_outputs->scoring_metric == BoxedDensity2) ||
                      (model_outputs_ext != NULL && model_outputs_ext->scoring_metric == BoxedDensity2);

    if (standardize)
    {
        if (is_density || is_bdens2)
        {
            ntrees = -ntrees;
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }

        else if (is_bdens)
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = -std::exp(output_depths[row] / ntrees);
        }

        else if (is_bratio)
        {
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = output_depths[row] / ntrees;
        }

        else
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = std::exp2( - output_depths[row] / depth_divisor );
        }
    }

    else
    {
        if (is_density || is_bdens || is_bdens2)
        {
            #ifndef _WIN32
            #pragma omp simd
            #endif
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] = std::exp(output_depths[row] / ntrees);
        }

        else if (is_bratio)
        {
            ntrees = -ntrees;
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }

        else
        {
            for (size_t row = 0; row < nrows; row++)
                output_depths[row] /= ntrees;
        }
    }

    if (per_tree_depths != NULL && (is_density || is_bdens || is_bdens2))
    {
        size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
        #ifndef _WIN32
        #pragma omp simd
        #endif
        for (size_t ix = 0; ix < nrows*ntrees; ix++)
            per_tree_depths[ix] = std::exp(per_tree_depths[ix]);
    }


    /* re-map tree numbers to start at zero (if predicting tree numbers) */
    /* Note: usually this type of 'prediction' is not required,
       thus this mapping is not stored in the model objects so as to
       save memory */
    if (tree_num != NULL)
    {
        if (indexer != NULL && !indexer->indices.empty())
        {
            size_t ntrees = (model_outputs != NULL)? model_outputs->trees.size() : model_outputs_ext->hplanes.size();
            if (model_outputs != NULL)
            {
                if (model_outputs->missing_action == Divide)
                    goto manual_remap;
                if (model_outputs->new_cat_action == Weighted && model_outputs->cat_split_type == SubSet && categ_data != NULL)
                    goto manual_remap;
            }

            for (size_t tree = 0; tree < ntrees; tree++)
            {
                size_t *restrict mapping = indexer->indices[tree].terminal_node_mappings.data();
                for (size_t row = 0; row < nrows; row++)
                {
                    tree_num[row + tree*nrows] = mapping[tree_num[row + tree*nrows]];
                }
            }
        }

        else
        {
            manual_remap:
            remap_terminal_trees(model_outputs, model_outputs_ext,
                                 prediction_data, tree_num, nthreads);
        }
    }
}